

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ScaleLayerParams::SerializeWithCachedSizes
          (ScaleLayerParams *this,CodedOutputStream *output)

{
  uint64 uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (this->shapescale_).current_size_;
  if (0 < iVar3) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_shapescale_cached_byte_size_);
    iVar3 = (this->shapescale_).current_size_;
  }
  iVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    uVar1 = shapescale(this,iVar2);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar1);
  }
  if (this != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_ &&
      this->scale_ != (WeightParams *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->scale_->super_MessageLite,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
  }
  iVar3 = (this->shapebias_).current_size_;
  if (0 < iVar3) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x22);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_shapebias_cached_byte_size_);
    iVar3 = (this->shapebias_).current_size_;
  }
  iVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    uVar1 = shapebias(this,iVar2);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar1);
  }
  if (this != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_ &&
      this->bias_ != (WeightParams *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&this->bias_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ScaleLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ScaleLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 shapeScale = 1;
  if (this->shapescale_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shapescale_cached_byte_size_);
  }
  for (int i = 0, n = this->shapescale_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->shapescale(i), output);
  }

  // .CoreML.Specification.WeightParams scale = 2;
  if (this->has_scale()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->scale_, output);
  }

  // bool hasBias = 3;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->hasbias(), output);
  }

  // repeated uint64 shapeBias = 4;
  if (this->shapebias_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shapebias_cached_byte_size_);
  }
  for (int i = 0, n = this->shapebias_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->shapebias(i), output);
  }

  // .CoreML.Specification.WeightParams bias = 5;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *this->bias_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ScaleLayerParams)
}